

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mount_point.cpp
# Opt level: O0

void __thiscall
cppcms::mount_point::mount_point
          (mount_point *this,selection_type sel,regex *http_host,regex *script,regex *path,int group
          )

{
  regex *in_RCX;
  regex *in_RDX;
  undefined4 in_ESI;
  regex *in_RDI;
  regex *in_R8;
  undefined4 in_R9D;
  
  booster::regex::regex(in_RDI,in_RDX);
  booster::regex::regex(in_RDI + 8,in_RCX);
  booster::regex::regex(in_RDI + 0x10,in_R8);
  *(undefined4 *)(in_RDI + 0x18) = in_R9D;
  *(undefined4 *)(in_RDI + 0x1c) = in_ESI;
  booster::copy_ptr<cppcms::mount_point::_data>::copy_ptr
            ((copy_ptr<cppcms::mount_point::_data> *)(in_RDI + 0x20));
  return;
}

Assistant:

mount_point::mount_point(	selection_type sel,
				booster::regex const &http_host,
				booster::regex const &script,
				booster::regex const &path,
				int group) 
	:	host_(http_host),
		script_name_(script),
		path_info_(path),
		group_(group),
		selection_(sel)
{
}